

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_frequencies.c
# Opt level: O0

greatest_test_res frequency_read(void)

{
  int iVar1;
  greatest_type_info *type_info_2;
  greatest_type_info *type_info_1;
  greatest_type_info *type_info;
  frequency_t freq_1;
  char *field_values [5];
  char *local_38;
  char *field_names [5];
  
  memcpy(&local_38,&DAT_0028ee90,0x28);
  memcpy(&freq_1.headway_secs,&PTR_anon_var_dwarf_267f_0028eec0,0x28);
  read_frequency((frequency_t *)((long)&type_info + 4),5,&local_38,(char **)&freq_1.headway_secs);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = greatest_do_assert_equal_t
                    ("0xC0FFEE",(void *)((long)&type_info + 4),&greatest_type_info_string,
                     (void *)0x0);
  if (iVar1 == 0) {
    if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
      ;
      greatest_info.fail_line = 0x13;
      greatest_info.msg = "type_info->equal callback missing!";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
      ;
      greatest_info.fail_line = 0x13;
      greatest_info.msg = "\"0xC0FFEE\" != freq_1.trip_id";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = greatest_do_assert_equal_t
                      ("05:00:00",freq_1.trip_id + 0x38,&greatest_type_info_string,(void *)0x0);
    if (iVar1 == 0) {
      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
        ;
        greatest_info.fail_line = 0x14;
        greatest_info.msg = "type_info->equal callback missing!";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
        ;
        greatest_info.fail_line = 0x14;
        greatest_info.msg = "\"05:00:00\" != freq_1.start_time";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("07:00:00",freq_1.start_time + 1,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
          ;
          greatest_info.fail_line = 0x15;
          greatest_info.msg = "type_info->equal callback missing!";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
          ;
          greatest_info.fail_line = 0x15;
          greatest_info.msg = "\"07:00:00\" != freq_1.end_time";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
        }
      }
      else if (freq_1.end_time._3_4_ == 0x4b0) {
        greatest_info.assertions = greatest_info.assertions + 2;
        if (freq_1._80_4_ == 0) {
          greatest_info.msg = (char *)0x0;
          field_names[4]._4_4_ = GREATEST_TEST_RES_PASS;
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
          ;
          greatest_info.fail_line = 0x17;
          greatest_info.msg = "TE_NOT_EXACT != freq_1.exact_times";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
        }
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
        ;
        greatest_info.fail_line = 0x16;
        greatest_info.msg = "1200 != freq_1.headway_secs";
        if ((greatest_info.flags & 4) != 0) {
          greatest_info.assertions = greatest_info.assertions + 1;
          abort();
        }
        field_names[4]._4_4_ = GREATEST_TEST_RES_FAIL;
        greatest_info.assertions = greatest_info.assertions + 1;
      }
    }
  }
  return field_names[4]._4_4_;
}

Assistant:

TEST frequency_read(void) {
    #define FIELDS_NUM_7 5
    char *field_names[FIELDS_NUM_7] = {
        "trip_id", "start_time", "end_time", "headway_secs", "exact_times"
    };
    char *field_values[FIELDS_NUM_7] = {
        "0xC0FFEE", "05:00:00", "07:00:00", "1200", ""
    };

    frequency_t freq_1;
    read_frequency(&freq_1, FIELDS_NUM_7, (const char **)field_names, (const char **)field_values);

    ASSERT_STR_EQ("0xC0FFEE", freq_1.trip_id);
    ASSERT_STR_EQ("05:00:00", freq_1.start_time);
    ASSERT_STR_EQ("07:00:00", freq_1.end_time);
    ASSERT_EQ(1200, freq_1.headway_secs);
    ASSERT_EQ(TE_NOT_EXACT, freq_1.exact_times);

    PASS();
}